

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

void __thiscall
Frame::Frame(Frame *this,ClassInstance *object,ClassRuntime *classRuntime,string *methodName,
            string *methodDescriptor,vector<Value,_std::allocator<Value>_> *arguments)

{
  ValueType VVar1;
  u2 uVar2;
  u2 uVar3;
  u2 uVar4;
  string *classRuntime_00;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  mapped_type *pmVar8;
  method_info *pmVar9;
  string local_98 [32];
  string local_78 [32];
  method_info *local_58;
  method_info *method;
  int local_48;
  int i;
  vector<Value,_std::allocator<Value>_> *local_38;
  vector<Value,_std::allocator<Value>_> *arguments_local;
  string *methodDescriptor_local;
  string *methodName_local;
  ClassRuntime *classRuntime_local;
  ClassInstance *object_local;
  Frame *this_local;
  
  this->pc = 0;
  this->_object = object;
  local_38 = arguments;
  arguments_local = (vector<Value,_std::allocator<Value>_> *)methodDescriptor;
  methodDescriptor_local = methodName;
  methodName_local = (string *)classRuntime;
  classRuntime_local = (ClassRuntime *)object;
  object_local = (ClassInstance *)this;
  std::
  map<unsigned_int,_Value,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Value>_>_>
  ::map(&this->_localVariables);
  std::stack<Value,std::deque<Value,std::allocator<Value>>>::
  stack<std::deque<Value,std::allocator<Value>>,void>
            ((stack<Value,std::deque<Value,std::allocator<Value>>> *)&this->_operandStack);
  local_48 = 0;
  while( true ) {
    uVar5 = (ulong)local_48;
    sVar6 = std::vector<Value,_std::allocator<Value>_>::size(arguments);
    classRuntime_00 = methodName_local;
    if (sVar6 <= uVar5) break;
    pvVar7 = std::vector<Value,_std::allocator<Value>_>::operator[](arguments,(long)local_48);
    method._4_4_ = local_48;
    pmVar8 = std::
             map<unsigned_int,_Value,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Value>_>_>
             ::operator[](&this->_localVariables,(key_type *)((long)&method + 4));
    VVar1 = pvVar7->type;
    pmVar8->printType = pvVar7->printType;
    pmVar8->type = VVar1;
    pmVar8->data = pvVar7->data;
    local_48 = local_48 + 1;
  }
  std::__cxx11::string::string(local_78,(string *)methodName);
  std::__cxx11::string::string(local_98,(string *)methodDescriptor);
  pmVar9 = getMethodNamed(this,(ClassRuntime *)classRuntime_00,(string *)local_78,(string *)local_98
                         );
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_78);
  local_58 = pmVar9;
  if (pmVar9 != (method_info *)0x0) {
    uVar2 = pmVar9->name_index;
    uVar3 = pmVar9->descriptor_index;
    uVar4 = pmVar9->attributes_count;
    (this->_method).access_flags = pmVar9->access_flags;
    (this->_method).name_index = uVar2;
    (this->_method).descriptor_index = uVar3;
    (this->_method).attributes_count = uVar4;
    (this->_method).attributes = pmVar9->attributes;
    if (((this->_method).access_flags & 8) == 0) {
      findAttributes(this);
      return;
    }
    __assert_fail("(_method.access_flags & 0x0008) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/frame.cpp"
                  ,0x15,
                  "Frame::Frame(ClassInstance *, ClassRuntime *, string, string, vector<Value>)");
  }
  __assert_fail("method != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/frame.cpp",
                0x13,"Frame::Frame(ClassInstance *, ClassRuntime *, string, string, vector<Value>)")
  ;
}

Assistant:

Frame::Frame(ClassInstance *object, ClassRuntime *classRuntime, string methodName, string methodDescriptor, vector<Value> arguments) : pc(0), _object(object) {
    
    for (int i = 0; i < arguments.size(); i++) {
        _localVariables[i] = arguments[i];
    }
    
    method_info *method = getMethodNamed(classRuntime, methodName, methodDescriptor);
    assert(method != NULL);
    _method = *method;
    assert((_method.access_flags & 0x0008) == 0); // o método não pode ser estático
    
    findAttributes();
}